

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

rotation_t *
opengv::relative_pose::rotationOnly
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  size_t sVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  rotation_t *prVar13;
  ulong uVar14;
  double *pdVar15;
  Index outer;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 in_ZMM1 [64];
  MatrixXd Hcross;
  type tmp;
  Vector3d f;
  double local_f8;
  double local_f0;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  rotation_t *local_a0;
  double local_98 [10];
  undefined1 local_48 [16];
  double local_38;
  
  auVar27 = in_ZMM1._0_16_;
  sVar2 = indices->_numberCorrespondences;
  local_a0 = __return_storage_ptr__;
  if (sVar2 == 0) {
    local_f8 = 0.0;
    local_f0 = 0.0;
    local_c8 = ZEXT816(0);
    local_b8._0_16_ = ZEXT816(0);
  }
  else {
    lVar17 = 0;
    sVar21 = 0;
    local_b8._0_16_ = ZEXT816(0);
    local_f0 = 0.0;
    local_f8 = 0.0;
    local_c8 = ZEXT816(0);
    do {
      iVar20 = (int)sVar21;
      iVar16 = iVar20;
      if (indices->_useIndices != false) {
        iVar16 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar17 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,(long)iVar16);
      if (indices->_useIndices != false) {
        iVar20 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar17 >> 0x1e));
      }
      local_b8._8_8_ = (double)local_b8._8_8_ + local_98[1];
      local_b8._0_8_ = (double)local_b8._0_8_ + local_98[0];
      local_f8 = local_f8 + local_98[2];
      (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,(long)iVar20);
      auVar27 = in_ZMM1._0_16_;
      sVar21 = sVar21 + 1;
      lVar17 = lVar17 + 0x100000000;
      local_c8._8_8_ = (double)local_c8._8_8_ + local_98[1];
      local_c8._0_8_ = (double)local_c8._0_8_ + local_98[0];
      local_f0 = local_f0 + local_98[2];
    } while (sVar2 != sVar21);
  }
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,9,3,3);
  if ((local_e8.m_rows == 3) && (local_e8.m_cols == 3)) {
    uVar19 = 9;
    uVar18 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,9,3,3);
    uVar19 = local_e8.m_cols * local_e8.m_rows;
    uVar18 = uVar19 + 7;
    if (-1 < (long)uVar19) {
      uVar18 = uVar19;
    }
    uVar18 = uVar18 & 0xfffffffffffffff8;
    pdVar15 = local_e8.m_data;
    if ((long)uVar19 < 8) goto LAB_00134945;
  }
  pdVar15 = local_e8.m_data;
  uVar14 = 8;
  if (8 < (long)uVar18) {
    uVar14 = uVar18;
  }
  memset(local_e8.m_data,0,uVar14 * 8);
LAB_00134945:
  if (uVar19 - uVar18 != 0 && (long)uVar18 <= (long)uVar19) {
    memset(pdVar15 + uVar18,0,(uVar19 - uVar18) * 8);
  }
  if (sVar2 != 0) {
    auVar27 = vcvtusi2sd_avx512f(auVar27,sVar2);
    sVar21 = 0;
    dVar26 = auVar27._0_8_;
    auVar27._8_8_ = dVar26;
    auVar27._0_8_ = dVar26;
    local_b8._0_16_ = vdivpd_avx(local_b8._0_16_,auVar27);
    local_c8 = vdivpd_avx(local_c8,auVar27);
    do {
      iVar16 = (int)sVar21;
      iVar20 = iVar16;
      if (indices->_useIndices == true) {
        iVar20 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar16];
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(local_98,adapter,(long)iVar20);
      auVar11._8_8_ = local_98[1];
      auVar11._0_8_ = local_98[0];
      local_48 = vsubpd_avx(auVar11,local_b8._0_16_);
      local_38 = local_98[2] - local_f8 / dVar26;
      if (indices->_useIndices == true) {
        iVar16 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar16];
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(local_98,adapter,(long)iVar16);
      auVar12._8_8_ = local_98[1];
      auVar12._0_8_ = local_98[0];
      lVar17 = 0;
      auVar27 = vsubpd_avx(auVar12,local_c8);
      dVar10 = local_98[2] - local_f0 / dVar26;
      pdVar15 = local_98 + 2;
      do {
        dVar1 = *(double *)(local_48 + lVar17 * 8);
        lVar17 = lVar17 + 1;
        pdVar15[-2] = auVar27._0_8_ * dVar1;
        pdVar15[-1] = auVar27._8_8_ * dVar1;
        *pdVar15 = dVar10 * dVar1;
        pdVar15 = pdVar15 + 3;
      } while (lVar17 != 3);
      uVar19 = local_e8.m_cols * local_e8.m_rows;
      uVar18 = uVar19 + 7;
      if (-1 < (long)uVar19) {
        uVar18 = uVar19;
      }
      if (7 < (long)uVar19) {
        lVar17 = 0;
        do {
          auVar22 = vaddpd_avx512f(*(undefined1 (*) [64])(local_98 + lVar17),
                                   *(undefined1 (*) [64])(local_e8.m_data + lVar17));
          *(undefined1 (*) [64])(local_e8.m_data + lVar17) = auVar22;
          lVar17 = lVar17 + 8;
        } while (lVar17 < (long)(uVar18 & 0xfffffffffffffff8));
      }
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if ((long)uVar19 % 8 != 0 && (long)(uVar18 & 0xfffffffffffffff8) <= (long)uVar19) {
        lVar17 = (long)uVar18 >> 3;
        auVar23 = vpbroadcastq_avx512f();
        uVar18 = 0;
        do {
          auVar24 = vpbroadcastq_avx512f();
          auVar24 = vporq_avx512f(auVar24,auVar22);
          uVar14 = vpcmpuq_avx512f(auVar24,auVar23,2);
          pdVar15 = local_98 + lVar17 * 8 + uVar18;
          bVar3 = (byte)uVar14;
          auVar24._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar15[1];
          auVar24._0_8_ = (ulong)(bVar3 & 1) * (long)*pdVar15;
          auVar24._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar15[2];
          auVar24._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar15[3];
          auVar24._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar15[4];
          auVar24._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar15[5];
          auVar24._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar15[6];
          auVar24._56_8_ = (uVar14 >> 7) * (long)pdVar15[7];
          pdVar15 = local_e8.m_data + lVar17 * 8 + uVar18;
          auVar25._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar15[1];
          auVar25._0_8_ = (ulong)(bVar3 & 1) * (long)*pdVar15;
          auVar25._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar15[2];
          auVar25._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar15[3];
          auVar25._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar15[4];
          auVar25._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar15[5];
          auVar25._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar15[6];
          auVar25._56_8_ = (uVar14 >> 7) * (long)pdVar15[7];
          auVar24 = vaddpd_avx512f(auVar24,auVar25);
          pdVar15 = local_e8.m_data + lVar17 * 8 + uVar18;
          bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar14 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar14 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar14 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar14 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar14 >> 6) & 1);
          *pdVar15 = (double)((ulong)(bVar3 & 1) * auVar24._0_8_ |
                             (ulong)!(bool)(bVar3 & 1) * (long)*pdVar15);
          pdVar15[1] = (double)((ulong)bVar4 * auVar24._8_8_ | (ulong)!bVar4 * (long)pdVar15[1]);
          pdVar15[2] = (double)((ulong)bVar5 * auVar24._16_8_ | (ulong)!bVar5 * (long)pdVar15[2]);
          pdVar15[3] = (double)((ulong)bVar6 * auVar24._24_8_ | (ulong)!bVar6 * (long)pdVar15[3]);
          pdVar15[4] = (double)((ulong)bVar7 * auVar24._32_8_ | (ulong)!bVar7 * (long)pdVar15[4]);
          pdVar15[5] = (double)((ulong)bVar8 * auVar24._40_8_ | (ulong)!bVar8 * (long)pdVar15[5]);
          pdVar15[6] = (double)((ulong)bVar9 * auVar24._48_8_ | (ulong)!bVar9 * (long)pdVar15[6]);
          pdVar15[7] = (double)((uVar14 >> 7) * auVar24._56_8_ |
                               (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar15[7]);
          uVar18 = uVar18 + 8;
        } while (((long)uVar19 % 8 + 7U & 0xfffffffffffffff8) != uVar18);
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar2);
  }
  prVar13 = local_a0;
  math::arun(local_a0,(MatrixXd *)&local_e8);
  if (local_e8.m_data != (double *)0x0) {
    free((void *)local_e8.m_data[-1]);
  }
  return prVar13;
}

Assistant:

rotation_t rotationOnly(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 2);

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f = adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime =
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  return math::arun(Hcross);
}